

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O0

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CMethod *statement)

{
  bool bVar1;
  pointer pCVar2;
  string *methodName;
  pointer pCVar3;
  pointer pIVar4;
  pointer pIVar5;
  CSeqStatement *this_00;
  CMemExpression *this_01;
  CStatementWrapper *pCVar6;
  CSeqStatement *pCVar7;
  CLabelStatement *pCVar8;
  CMoveStatement *pCVar9;
  IAddress *pIVar10;
  map<std::__cxx11::string,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>
  *this_02;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_1d0;
  undefined1 local_1c3;
  undefined1 local_1c2;
  undefined1 local_1c1;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_1c0;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_1b8;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_1b0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_1a8;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_1a0;
  undefined1 local_191;
  string local_190 [32];
  CLabel local_170;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_150;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_148;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_140;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_138;
  undefined1 local_12c;
  undefined1 local_12b;
  undefined1 local_12a;
  undefined1 local_129;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_128;
  undefined1 local_119;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_118;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_110;
  unique_ptr<IRT::CExpression,_std::default_delete<IRT::CExpression>_> local_108;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_100;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_f8;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_f0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_e8;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_e0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_d8;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_d0;
  undefined1 local_c1;
  string local_c0 [32];
  CLabel local_a0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_80;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_78;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_70;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_68;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_60;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_58;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> expressionReturn;
  unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> statementListWrapper;
  undefined1 local_38 [8];
  string methodFullName;
  CMethod *statement_local;
  CBuildVisitor *this_local;
  
  std::operator<<((ostream *)&std::cout,"IRT builder: CMethodStm\n");
  pCVar2 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&statement->name);
  std::__cxx11::string::operator=((string *)&this->currentMethod,(string *)&pCVar2->name);
  buildNewFrame(this,statement);
  methodName = IRT::CFrame::GetClassName_abi_cxx11_(this->currentFrame);
  IRT::CFrame::GetMethodName_abi_cxx11_(this->currentFrame);
  GetMethodFullName((CBuildVisitor *)local_38,(string *)this,methodName);
  pCVar3 = std::unique_ptr<CCompoundStm,_std::default_delete<CCompoundStm>_>::operator->
                     (&statement->statements);
  (**(pCVar3->super_IStatement).super_PositionedNode.super_INode._vptr_INode)(pCVar3,this);
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::unique_ptr
            ((unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> *)
             &expressionReturn,&this->wrapper);
  pIVar4 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                     (&statement->returnExp);
  (**(pIVar4->super_PositionedNode).super_INode._vptr_INode)(pIVar4,this);
  pIVar5 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
           operator->(&this->wrapper);
  (**pIVar5->_vptr_ISubtreeWrapper)(&local_60);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_58,&local_60);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_60);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&expressionReturn);
  if (bVar1) {
    pCVar6 = (CStatementWrapper *)operator_new(0x10);
    local_12c = 1;
    pCVar7 = (CSeqStatement *)operator_new(0x18);
    local_12b = 1;
    pCVar8 = (CLabelStatement *)operator_new(0x28);
    local_c1 = 1;
    std::__cxx11::string::string(local_c0,(string *)local_38);
    IRT::CLabel::CLabel(&local_a0,(string *)local_c0);
    IRT::CLabelStatement::CLabelStatement(pCVar8,&local_a0);
    local_c1 = 0;
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_80,(pointer)pCVar8);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_78,&local_80);
    this_00 = (CSeqStatement *)operator_new(0x18);
    local_12a = 1;
    pIVar5 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
             operator->((unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                         *)&expressionReturn);
    (*pIVar5->_vptr_ISubtreeWrapper[1])(&local_e8);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_e0,&local_e8);
    pCVar9 = (CMoveStatement *)operator_new(0x18);
    local_129 = 1;
    this_01 = (CMemExpression *)operator_new(0x10);
    local_119 = 1;
    pIVar10 = IRT::CFrame::GetReturnValueAddress(this->currentFrame);
    (*pIVar10->_vptr_IAddress[2])(&local_118);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_110,&local_118);
    IRT::CMemExpression::CMemExpression(this_01,&local_110);
    local_119 = 0;
    std::unique_ptr<IRT::CExpression,std::default_delete<IRT::CExpression>>::
    unique_ptr<std::default_delete<IRT::CExpression>,void>
              ((unique_ptr<IRT::CExpression,std::default_delete<IRT::CExpression>> *)&local_108,
               (pointer)this_01);
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<IRT::CExpression,std::default_delete<IRT::CExpression>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_100,&local_108);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_128,&local_58);
    IRT::CMoveStatement::CMoveStatement(pCVar9,&local_100,&local_128);
    local_129 = 0;
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_f8,(pointer)pCVar9);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_f0,&local_f8);
    IRT::CSeqStatement::CSeqStatement(this_00,&local_e0,&local_f0);
    local_12a = 0;
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_d8,(pointer)this_00);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_d0,&local_d8);
    IRT::CSeqStatement::CSeqStatement(pCVar7,&local_78,&local_d0);
    local_12b = 0;
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_70,(pointer)pCVar7);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_68,&local_70);
    IRT::CStatementWrapper::CStatementWrapper(pCVar6,&local_68);
    local_12c = 0;
    updateSubtreeWrapper(this,(ISubtreeWrapper *)pCVar6);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_68);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_70);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_d0);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_d8);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_f0);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_f8);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_128);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_100);
    std::unique_ptr<IRT::CExpression,_std::default_delete<IRT::CExpression>_>::~unique_ptr
              (&local_108);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_110);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_118);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_e0);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_e8);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_78);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_80);
    IRT::CLabel::~CLabel(&local_a0);
    std::__cxx11::string::~string(local_c0);
  }
  else {
    pCVar6 = (CStatementWrapper *)operator_new(0x10);
    local_1c3 = 1;
    pCVar7 = (CSeqStatement *)operator_new(0x18);
    local_1c2 = 1;
    pCVar8 = (CLabelStatement *)operator_new(0x28);
    local_191 = 1;
    std::__cxx11::string::string(local_190,(string *)local_38);
    IRT::CLabel::CLabel(&local_170,(string *)local_190);
    IRT::CLabelStatement::CLabelStatement(pCVar8,&local_170);
    local_191 = 0;
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_150,(pointer)pCVar8);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_148,&local_150);
    pCVar9 = (CMoveStatement *)operator_new(0x18);
    local_1c1 = 1;
    pIVar10 = IRT::CFrame::GetReturnValueAddress(this->currentFrame);
    (*pIVar10->_vptr_IAddress[2])(&local_1b8);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_1b0,&local_1b8);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_1c0,&local_58);
    IRT::CMoveStatement::CMoveStatement(pCVar9,&local_1b0,&local_1c0);
    local_1c1 = 0;
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_1a8,(pointer)pCVar9);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_1a0,&local_1a8);
    IRT::CSeqStatement::CSeqStatement(pCVar7,&local_148,&local_1a0);
    local_1c2 = 0;
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_140,(pointer)pCVar7);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_138,&local_140);
    IRT::CStatementWrapper::CStatementWrapper(pCVar6,&local_138);
    local_1c3 = 0;
    updateSubtreeWrapper(this,(ISubtreeWrapper *)pCVar6);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_138);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_140);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_1a0);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_1a8);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_1c0);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_1b0);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_1b8);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_148);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_150);
    IRT::CLabel::~CLabel(&local_170);
    std::__cxx11::string::~string(local_190);
  }
  this_02 = (map<std::__cxx11::string,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>
             *)std::
               __shared_ptr_access<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->treesOfMethods);
  pIVar5 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
           operator->(&this->wrapper);
  (*pIVar5->_vptr_ISubtreeWrapper[1])(&local_1d0);
  std::
  map<std::__cxx11::string,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>
  ::
  emplace<std::__cxx11::string&,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>
            (this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             &local_1d0);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_1d0);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_58);
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::~unique_ptr
            ((unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> *)
             &expressionReturn);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void CBuildVisitor::Visit( CMethod &statement ) {

    std::cout << "IRT builder: CMethodStm\n";
    currentMethod = statement.name->name;
    buildNewFrame( &statement );
    std::string methodFullName = GetMethodFullName( currentFrame->GetClassName( ), currentFrame->GetMethodName( ));

    statement.statements->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> statementListWrapper = std::move( wrapper );

    statement.returnExp->Accept( *this );
    std::unique_ptr<const IRT::CExpression> expressionReturn = std::move( wrapper->ToExpression( ));

    if ( statementListWrapper ) {
        updateSubtreeWrapper( new IRT::CStatementWrapper(
                std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CSeqStatement(
                        std::move( std::unique_ptr<const IRT::CStatement>(
                                new IRT::CLabelStatement( IRT::CLabel( methodFullName )))),
                        std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CSeqStatement(
                                std::move( statementListWrapper->ToStatement( )),
                                std::move( std::unique_ptr<const IRT::CStatement>(
                                        new IRT::CMoveStatement(
                                                std::move( std::unique_ptr<IRT::CExpression>( new IRT::CMemExpression(
                                                        std::move(
                                                                currentFrame->GetReturnValueAddress( )->ToExpression( ))))),
                                                std::move( expressionReturn )
                                        )
                                ))
                        )))
                )))
        ));
    } else {
        updateSubtreeWrapper( new IRT::CStatementWrapper(
                std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CSeqStatement(
                        std::move( std::unique_ptr<const IRT::CStatement>(
                                new IRT::CLabelStatement( IRT::CLabel( methodFullName )))),
                        std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CMoveStatement(
                                std::move( currentFrame->GetReturnValueAddress( )->ToExpression( )),
                                std::move( expressionReturn )
                        )))
                )))
        ));
    }

    treesOfMethods->emplace( methodFullName, std::move( wrapper->ToStatement( )));
}